

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

int gladLoadGLES2Loader(GLADloadproc load)

{
  int iVar1;
  GLubyte *pGVar2;
  code *in_RDI;
  bool local_11;
  uint local_4;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*in_RDI)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    local_4 = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      local_4 = 0;
    }
    else {
      find_coreGLES2();
      load_GL_ES_VERSION_2_0((GLADloadproc)0x10a7b3);
      iVar1 = find_extensionsGLES2();
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        load_GL_AMD_performance_monitor((GLADloadproc)0x10a7d4);
        load_GL_ANGLE_framebuffer_blit((GLADloadproc)0x10a7de);
        load_GL_ANGLE_framebuffer_multisample((GLADloadproc)0x10a7e8);
        load_GL_ANGLE_instanced_arrays((GLADloadproc)0x10a7f2);
        load_GL_ANGLE_translated_shader_source((GLADloadproc)0x10a7fc);
        load_GL_APPLE_copy_texture_levels((GLADloadproc)0x10a806);
        load_GL_APPLE_framebuffer_multisample((GLADloadproc)0x10a810);
        load_GL_APPLE_sync((GLADloadproc)0x10a81a);
        load_GL_EXT_base_instance((GLADloadproc)0x10a824);
        load_GL_EXT_blend_func_extended((GLADloadproc)0x10a82e);
        load_GL_EXT_blend_minmax((GLADloadproc)0x10a838);
        load_GL_EXT_buffer_storage((GLADloadproc)0x10a842);
        load_GL_EXT_clear_texture((GLADloadproc)0x10a84c);
        load_GL_EXT_copy_image((GLADloadproc)0x10a856);
        load_GL_EXT_debug_label((GLADloadproc)0x10a860);
        load_GL_EXT_debug_marker((GLADloadproc)0x10a86a);
        load_GL_EXT_discard_framebuffer((GLADloadproc)0x10a874);
        load_GL_EXT_disjoint_timer_query((GLADloadproc)0x10a87e);
        load_GL_EXT_draw_buffers((GLADloadproc)0x10a888);
        load_GL_EXT_draw_buffers_indexed((GLADloadproc)0x10a892);
        load_GL_EXT_draw_elements_base_vertex((GLADloadproc)0x10a89c);
        load_GL_EXT_draw_instanced((GLADloadproc)0x10a8a6);
        load_GL_EXT_draw_transform_feedback((GLADloadproc)0x10a8b0);
        load_GL_EXT_external_buffer((GLADloadproc)0x10a8ba);
        load_GL_EXT_geometry_shader((GLADloadproc)0x10a8c4);
        load_GL_EXT_instanced_arrays((GLADloadproc)0x10a8ce);
        load_GL_EXT_map_buffer_range((GLADloadproc)0x10a8d8);
        load_GL_EXT_memory_object((GLADloadproc)0x10a8e2);
        load_GL_EXT_memory_object_fd((GLADloadproc)0x10a8ec);
        load_GL_EXT_memory_object_win32((GLADloadproc)0x10a8f6);
        load_GL_EXT_multi_draw_arrays((GLADloadproc)0x10a900);
        load_GL_EXT_multi_draw_indirect((GLADloadproc)0x10a90a);
        load_GL_EXT_multisampled_render_to_texture((GLADloadproc)0x10a914);
        load_GL_EXT_multiview_draw_buffers((GLADloadproc)0x10a91e);
        load_GL_EXT_occlusion_query_boolean((GLADloadproc)0x10a928);
        load_GL_EXT_polygon_offset_clamp((GLADloadproc)0x10a932);
        load_GL_EXT_primitive_bounding_box((GLADloadproc)0x10a93c);
        load_GL_EXT_raster_multisample((GLADloadproc)0x10a946);
        load_GL_EXT_robustness((GLADloadproc)0x10a950);
        load_GL_EXT_semaphore((GLADloadproc)0x10a95a);
        load_GL_EXT_semaphore_fd((GLADloadproc)0x10a964);
        load_GL_EXT_semaphore_win32((GLADloadproc)0x10a96e);
        load_GL_EXT_separate_shader_objects((GLADloadproc)0x10a978);
        load_GL_EXT_shader_pixel_local_storage2((GLADloadproc)0x10a982);
        load_GL_EXT_sparse_texture((GLADloadproc)0x10a98c);
        load_GL_EXT_tessellation_shader((GLADloadproc)0x10a996);
        load_GL_EXT_texture_border_clamp((GLADloadproc)0x10a9a0);
        load_GL_EXT_texture_buffer((GLADloadproc)0x10a9aa);
        load_GL_EXT_texture_filter_minmax((GLADloadproc)0x10a9b4);
        load_GL_EXT_texture_storage((GLADloadproc)0x10a9be);
        load_GL_EXT_texture_view((GLADloadproc)0x10a9c8);
        load_GL_EXT_win32_keyed_mutex((GLADloadproc)0x10a9d2);
        load_GL_EXT_window_rectangles((GLADloadproc)0x10a9dc);
        load_GL_IMG_bindless_texture((GLADloadproc)0x10a9e6);
        load_GL_IMG_framebuffer_downsample((GLADloadproc)0x10a9f0);
        load_GL_IMG_multisampled_render_to_texture((GLADloadproc)0x10a9fa);
        load_GL_INTEL_framebuffer_CMAA((GLADloadproc)0x10aa04);
        load_GL_INTEL_performance_query((GLADloadproc)0x10aa0e);
        load_GL_KHR_blend_equation_advanced((GLADloadproc)0x10aa18);
        load_GL_KHR_debug((GLADloadproc)0x10aa22);
        load_GL_KHR_robustness((GLADloadproc)0x10aa2c);
        load_GL_NV_bindless_texture((GLADloadproc)0x10aa36);
        load_GL_NV_blend_equation_advanced((GLADloadproc)0x10aa40);
        load_GL_NV_conditional_render((GLADloadproc)0x10aa4a);
        load_GL_NV_conservative_raster((GLADloadproc)0x10aa54);
        load_GL_NV_conservative_raster_pre_snap_triangles((GLADloadproc)0x10aa5e);
        load_GL_NV_copy_buffer((GLADloadproc)0x10aa68);
        load_GL_NV_coverage_sample((GLADloadproc)0x10aa72);
        load_GL_NV_draw_buffers((GLADloadproc)0x10aa7c);
        load_GL_NV_draw_instanced((GLADloadproc)0x10aa86);
        load_GL_NV_draw_vulkan_image((GLADloadproc)0x10aa90);
        load_GL_NV_fence((GLADloadproc)0x10aa9a);
        load_GL_NV_fragment_coverage_to_color((GLADloadproc)0x10aaa4);
        load_GL_NV_framebuffer_blit((GLADloadproc)0x10aaae);
        load_GL_NV_framebuffer_mixed_samples((GLADloadproc)0x10aab8);
        load_GL_NV_framebuffer_multisample((GLADloadproc)0x10aac2);
        load_GL_NV_gpu_shader5((GLADloadproc)0x10aacc);
        load_GL_NV_instanced_arrays((GLADloadproc)0x10aad6);
        load_GL_NV_internalformat_sample_query((GLADloadproc)0x10aae0);
        load_GL_NV_non_square_matrices((GLADloadproc)0x10aaea);
        load_GL_NV_path_rendering((GLADloadproc)0x10aaf4);
        load_GL_NV_polygon_mode((GLADloadproc)0x10aafe);
        load_GL_NV_read_buffer((GLADloadproc)0x10ab08);
        load_GL_NV_sample_locations((GLADloadproc)0x10ab12);
        load_GL_NV_viewport_array((GLADloadproc)0x10ab1c);
        load_GL_NV_viewport_swizzle((GLADloadproc)0x10ab26);
        load_GL_OES_EGL_image((GLADloadproc)0x10ab30);
        load_GL_OES_copy_image((GLADloadproc)0x10ab3a);
        load_GL_OES_draw_buffers_indexed((GLADloadproc)0x10ab44);
        load_GL_OES_draw_elements_base_vertex((GLADloadproc)0x10ab4e);
        load_GL_OES_geometry_shader((GLADloadproc)0x10ab58);
        load_GL_OES_get_program_binary((GLADloadproc)0x10ab62);
        load_GL_OES_mapbuffer((GLADloadproc)0x10ab6c);
        load_GL_OES_primitive_bounding_box((GLADloadproc)0x10ab76);
        load_GL_OES_sample_shading((GLADloadproc)0x10ab80);
        load_GL_OES_tessellation_shader((GLADloadproc)0x10ab8a);
        load_GL_OES_texture_3D((GLADloadproc)0x10ab94);
        load_GL_OES_texture_border_clamp((GLADloadproc)0x10ab9e);
        load_GL_OES_texture_buffer((GLADloadproc)0x10aba8);
        load_GL_OES_texture_storage_multisample_2d_array((GLADloadproc)0x10abb2);
        load_GL_OES_texture_view((GLADloadproc)0x10abbc);
        load_GL_OES_vertex_array_object((GLADloadproc)0x10abc6);
        load_GL_OES_viewport_array((GLADloadproc)0x10abd0);
        load_GL_OVR_multiview((GLADloadproc)0x10abda);
        load_GL_OVR_multiview_multisampled_render_to_texture((GLADloadproc)0x10abe4);
        load_GL_QCOM_alpha_test((GLADloadproc)0x10abee);
        load_GL_QCOM_driver_control((GLADloadproc)0x10abf8);
        load_GL_QCOM_extended_get((GLADloadproc)0x10ac02);
        load_GL_QCOM_extended_get2((GLADloadproc)0x10ac0c);
        load_GL_QCOM_framebuffer_foveated((GLADloadproc)0x10ac16);
        load_GL_QCOM_shader_framebuffer_fetch_noncoherent((GLADloadproc)0x10ac20);
        load_GL_QCOM_tiled_rendering((GLADloadproc)0x10ac2a);
        local_11 = GLVersion.major != 0 || GLVersion.minor != 0;
        local_4 = (uint)local_11;
      }
    }
  }
  return local_4;
}

Assistant:

int gladLoadGLES2Loader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGLES2();
	load_GL_ES_VERSION_2_0(load);

	if (!find_extensionsGLES2()) return 0;
	load_GL_AMD_performance_monitor(load);
	load_GL_ANGLE_framebuffer_blit(load);
	load_GL_ANGLE_framebuffer_multisample(load);
	load_GL_ANGLE_instanced_arrays(load);
	load_GL_ANGLE_translated_shader_source(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_APPLE_sync(load);
	load_GL_EXT_base_instance(load);
	load_GL_EXT_blend_func_extended(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_EXT_buffer_storage(load);
	load_GL_EXT_clear_texture(load);
	load_GL_EXT_copy_image(load);
	load_GL_EXT_debug_label(load);
	load_GL_EXT_debug_marker(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_EXT_disjoint_timer_query(load);
	load_GL_EXT_draw_buffers(load);
	load_GL_EXT_draw_buffers_indexed(load);
	load_GL_EXT_draw_elements_base_vertex(load);
	load_GL_EXT_draw_instanced(load);
	load_GL_EXT_draw_transform_feedback(load);
	load_GL_EXT_external_buffer(load);
	load_GL_EXT_geometry_shader(load);
	load_GL_EXT_instanced_arrays(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_EXT_memory_object(load);
	load_GL_EXT_memory_object_fd(load);
	load_GL_EXT_memory_object_win32(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_EXT_multi_draw_indirect(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_EXT_multiview_draw_buffers(load);
	load_GL_EXT_occlusion_query_boolean(load);
	load_GL_EXT_polygon_offset_clamp(load);
	load_GL_EXT_primitive_bounding_box(load);
	load_GL_EXT_raster_multisample(load);
	load_GL_EXT_robustness(load);
	load_GL_EXT_semaphore(load);
	load_GL_EXT_semaphore_fd(load);
	load_GL_EXT_semaphore_win32(load);
	load_GL_EXT_separate_shader_objects(load);
	load_GL_EXT_shader_pixel_local_storage2(load);
	load_GL_EXT_sparse_texture(load);
	load_GL_EXT_tessellation_shader(load);
	load_GL_EXT_texture_border_clamp(load);
	load_GL_EXT_texture_buffer(load);
	load_GL_EXT_texture_filter_minmax(load);
	load_GL_EXT_texture_storage(load);
	load_GL_EXT_texture_view(load);
	load_GL_EXT_win32_keyed_mutex(load);
	load_GL_EXT_window_rectangles(load);
	load_GL_IMG_bindless_texture(load);
	load_GL_IMG_framebuffer_downsample(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_INTEL_framebuffer_CMAA(load);
	load_GL_INTEL_performance_query(load);
	load_GL_KHR_blend_equation_advanced(load);
	load_GL_KHR_debug(load);
	load_GL_KHR_robustness(load);
	load_GL_NV_bindless_texture(load);
	load_GL_NV_blend_equation_advanced(load);
	load_GL_NV_conditional_render(load);
	load_GL_NV_conservative_raster(load);
	load_GL_NV_conservative_raster_pre_snap_triangles(load);
	load_GL_NV_copy_buffer(load);
	load_GL_NV_coverage_sample(load);
	load_GL_NV_draw_buffers(load);
	load_GL_NV_draw_instanced(load);
	load_GL_NV_draw_vulkan_image(load);
	load_GL_NV_fence(load);
	load_GL_NV_fragment_coverage_to_color(load);
	load_GL_NV_framebuffer_blit(load);
	load_GL_NV_framebuffer_mixed_samples(load);
	load_GL_NV_framebuffer_multisample(load);
	load_GL_NV_gpu_shader5(load);
	load_GL_NV_instanced_arrays(load);
	load_GL_NV_internalformat_sample_query(load);
	load_GL_NV_non_square_matrices(load);
	load_GL_NV_path_rendering(load);
	load_GL_NV_polygon_mode(load);
	load_GL_NV_read_buffer(load);
	load_GL_NV_sample_locations(load);
	load_GL_NV_viewport_array(load);
	load_GL_NV_viewport_swizzle(load);
	load_GL_OES_EGL_image(load);
	load_GL_OES_copy_image(load);
	load_GL_OES_draw_buffers_indexed(load);
	load_GL_OES_draw_elements_base_vertex(load);
	load_GL_OES_geometry_shader(load);
	load_GL_OES_get_program_binary(load);
	load_GL_OES_mapbuffer(load);
	load_GL_OES_primitive_bounding_box(load);
	load_GL_OES_sample_shading(load);
	load_GL_OES_tessellation_shader(load);
	load_GL_OES_texture_3D(load);
	load_GL_OES_texture_border_clamp(load);
	load_GL_OES_texture_buffer(load);
	load_GL_OES_texture_storage_multisample_2d_array(load);
	load_GL_OES_texture_view(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_OES_viewport_array(load);
	load_GL_OVR_multiview(load);
	load_GL_OVR_multiview_multisampled_render_to_texture(load);
	load_GL_QCOM_alpha_test(load);
	load_GL_QCOM_driver_control(load);
	load_GL_QCOM_extended_get(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_QCOM_framebuffer_foveated(load);
	load_GL_QCOM_shader_framebuffer_fetch_noncoherent(load);
	load_GL_QCOM_tiled_rendering(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}